

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void print_iterative_algorithm_info(Iterative_Method_parameters *parameters)

{
  IterProcType p_Var1;
  undefined8 uVar2;
  undefined6 local_108;
  undefined2 uStack_102;
  undefined1 uStack_100;
  undefined5 uStack_ff;
  undefined1 uStack_fa;
  undefined1 uStack_f9;
  undefined2 uStack_f8;
  undefined1 uStack_f6;
  undefined8 local_88;
  
  if (parameters->implementation == Implementation_Laspack) {
    p_Var1 = parameters->method_laspack;
    if (p_Var1 == CGNIter) {
      uVar2 = 0x73614c28204e4743;
LAB_001049d0:
      uStack_ff = 0x296b6361;
      uStack_100 = 0x70;
      local_108 = (undefined6)uVar2;
      uStack_102 = (undefined2)((ulong)uVar2 >> 0x30);
    }
    else {
      if (p_Var1 == CGSIter) {
        uVar2 = 0x73614c2820534743;
        goto LAB_001049d0;
      }
      if (p_Var1 == BiCGSTABIter) {
        local_108 = 0x745347436942;
        uStack_102 = 0x6261;
        uStack_100 = 0x20;
        uStack_ff = 0x7073614c28;
        uStack_fa = 0x61;
        uStack_f9 = 99;
        uStack_f8 = 0x296b;
        uStack_f6 = 0;
      }
      else {
        if (p_Var1 == QMRIter) {
          uVar2 = 0x73614c2820524d51;
          goto LAB_001049d0;
        }
        if (p_Var1 == GMRESIter) {
          local_108 = 0x205345524d47;
          uStack_102 = 0x4c28;
          uStack_100 = 0x61;
          uStack_ff = 0x6b63617073;
          uStack_fa = 0x29;
          uStack_f9 = 0;
        }
        else {
          local_108 = 0x574f4e4b4e55;
          uStack_102 = 0x204e;
          uStack_100 = 0x28;
          uStack_ff = 0x617073614c;
          uStack_fa = 99;
          uStack_f9 = 0x6b;
          uStack_f8 = 0x29;
        }
      }
    }
    if (parameters->preconditioner_type_laspack == JacobiPrecond) {
LAB_001049fe:
      local_88 = CONCAT17(local_88._7_1_,0x69626f000000);
      local_88 = CONCAT44(local_88._4_4_,0x6f63614a);
      goto LAB_00104a29;
    }
    if (parameters->preconditioner_type_laspack == SSORPrecond) {
      local_88 = (ulong)local_88._5_3_ << 0x28;
      local_88 = CONCAT44(local_88._4_4_,0x524f5353);
      goto LAB_00104a29;
    }
  }
  else {
    if (parameters->implementation != Implementation_Native) goto LAB_00104a29;
    if (parameters->method == Iterative_method_BiCGSTAB) {
      local_108 = 0x545347436942;
      uStack_102 = 0x4241;
      uStack_100 = 0;
    }
    else {
      local_108 = 0x574f4e4b4e55;
      uStack_102 = 0x4e;
    }
    if (parameters->preconditioner_type == Precond_Jacobi) goto LAB_001049fe;
    if (parameters->preconditioner_type == Precond_Null) {
      local_88 = (ulong)local_88._5_3_ << 0x28;
      local_88 = CONCAT44(local_88._4_4_,0x6c6c754e);
      goto LAB_00104a29;
    }
  }
  local_88 = 0x4e574f4e4b4e55;
LAB_00104a29:
  printf("Using %s iterative method with %s preconditioner\n",&local_108,&local_88);
  return;
}

Assistant:

void print_iterative_algorithm_info (Iterative_Method_parameters const * parameters) {
  unsigned const BUFFER_SIZE = 128;
  char method_to_string[BUFFER_SIZE];
  char preconditioner_to_string[BUFFER_SIZE];

  if (parameters->implementation == Implementation_Native) {
    if (parameters->method == Iterative_method_BiCGSTAB) {
      sprintf (method_to_string, "BiCGSTAB");
    } else {
      /* nothing to do here */
      sprintf (method_to_string, "UNKNOWN");
    }

    if (parameters->preconditioner_type == Precond_Jacobi) {
      sprintf (preconditioner_to_string, "Jacobi");
    } else if (parameters->preconditioner_type == Precond_Null) {
      sprintf (preconditioner_to_string, "Null");
    } else {
      /* nothing to do here */
      sprintf (preconditioner_to_string, "UNKNOWN");
    }
  }

#ifndef NO_LASPACK
  if (parameters->implementation == Implementation_Laspack) {
    if (parameters->method_laspack == CGNIter) {
      sprintf (method_to_string, "CGN (Laspack)");
    } else if (parameters->method_laspack == CGSIter) {
      sprintf (method_to_string, "CGS (Laspack)");
    } else if (parameters->method_laspack == BiCGSTABIter) {
      sprintf (method_to_string, "BiCGStab (Laspack)");
    } else if (parameters->method_laspack == QMRIter) {
      sprintf (method_to_string, "QMR (Laspack)");
    } else if (parameters->method_laspack == GMRESIter) {
      sprintf (method_to_string, "GMRES (Laspack)");
    } else {
      /* nothing to do here */
      sprintf (method_to_string, "UNKNOWN (Laspack)");
    }

    if (parameters->preconditioner_type_laspack == JacobiPrecond) {
      sprintf (preconditioner_to_string, "Jacobi");
    } else if (parameters->preconditioner_type_laspack == SSORPrecond) {
      sprintf (preconditioner_to_string, "SSOR");
    } else {
      /* nothing to do here */
      sprintf (preconditioner_to_string, "UNKNOWN");
    }
  }
#endif /* NO_LASPACK */

#ifdef ALTERNATIVE_OUTPUT
  printf (FANCY_INFO "Method: %s.\n", method_to_string);
  printf (FANCY_INFO "Preconditioner: %s.\n", preconditioner_to_string);
  printf (FANCY_INFO "Relaxation constant: %lg.\n", parameters->relaxation_constant);
#else
  printf ("Using %s iterative method with %s preconditioner\n", 
          method_to_string, 
          preconditioner_to_string);
#endif /* ALTERNATIVE_OUTPUT */

  return;
}